

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-dcm-bias-estimation.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  
  iVar1 = testUnidimDcmBiasEstimator(2);
  if (iVar1 == 0) {
    iVar1 = testDcmBiasEstimator(3);
    if (iVar1 == 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Succeeded");
      iVar1 = 0;
      goto LAB_00105039;
    }
    pcVar3 = "Failed, testDcmBiasEstimator error code: ";
  }
  else {
    pcVar3 = "Failed, testUnidimDcmBiasEstimator error code: ";
  }
  poVar2 = std::operator<<((ostream *)&std::cout,pcVar3);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,iVar1);
LAB_00105039:
  std::endl<char,std::char_traits<char>>(poVar2);
  return iVar1;
}

Assistant:

int main()
{
  int exitCode;

  exitCode = testUnidimDcmBiasEstimator(2);

  if(exitCode != 0)
  {
    std::cout << "Failed, testUnidimDcmBiasEstimator error code: " << exitCode << std::endl;
    return exitCode;
  }

  exitCode = testDcmBiasEstimator(3);
  if(exitCode != 0)
  {
    std::cout << "Failed, testDcmBiasEstimator error code: " << exitCode << std::endl;
    return exitCode;
  }

  std::cout << "Succeeded" << std::endl;
  return exitCode;
}